

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> __thiscall
fmt::v8::detail::digit_grouping<char32_t>::
apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
          (digit_grouping<char32_t> *this,
          back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,
          basic_string_view<char32_t> digits)

{
  type tVar1;
  ulong uVar2;
  int value;
  ulong uVar3;
  int iVar4;
  int i;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> separators;
  char32_t local_844;
  char32_t *local_840;
  next_state local_838;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> local_828;
  
  uVar2 = digits.size_;
  local_840 = digits.data_;
  local_828.super_buffer<int>.ptr_ = local_828.store_;
  local_828.super_buffer<int>.size_ = 0;
  local_828.super_buffer<int>._vptr_buffer = (_func_int **)&PTR_grow_001e68e0;
  local_828.super_buffer<int>.capacity_ = 500;
  local_838.group._M_current = local_838.group._M_current & 0xffffffff00000000;
  buffer<int>::push_back(&local_828.super_buffer<int>,(int *)&local_838);
  local_838.group._M_current = (this->sep_).grouping._M_dataplus._M_p;
  local_838.pos = 0;
  while( true ) {
    local_844 = next(this,&local_838);
    if ((local_844 == L'\0') || ((char32_t)digits.size_ <= local_844)) break;
    buffer<int>::push_back(&local_828.super_buffer<int>,&local_844);
  }
  iVar4 = (int)local_828.super_buffer<int>.size_ + -1;
  uVar3 = 0;
  value = 0;
  if (L'\0' < (char32_t)digits.size_) {
    uVar3 = uVar2 & 0xffffffff;
    value = 0;
  }
  for (; (int)uVar3 != value; value = value + 1) {
    if ((int)uVar2 == local_828.super_buffer<int>.ptr_[iVar4]) {
      local_844 = (this->sep_).thousands_sep;
      buffer<char32_t>::push_back(out.container,&local_844);
      iVar4 = iVar4 + -1;
    }
    tVar1 = to_unsigned<int>(value);
    local_844 = local_840[tVar1];
    buffer<char32_t>::push_back(out.container,&local_844);
    uVar2 = (ulong)((int)uVar2 - 1);
  }
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::~basic_memory_buffer(&local_828);
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }